

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::recomputeBounds
          (iterator *this,uint32_t level)

{
  pointer pEVar1;
  long lVar2;
  ulong *puVar3;
  ulong uVar4;
  uint32_t size;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_> *this_00
  ;
  interval<unsigned_long> *piVar5;
  ulong uVar6;
  long lVar7;
  interval<unsigned_long> iVar8;
  
  uVar6 = (ulong)level;
  for (lVar7 = uVar6 << 4; lVar7 != 0; lVar7 = lVar7 + -0x10) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar4 = (ulong)*(uint *)((long)pEVar1 + lVar7 + -4);
    if (uVar6 == 1) {
      puVar3 = (ulong *)((long)pEVar1->node + uVar4 * 8);
      piVar5 = (interval<unsigned_long> *)((long)pEVar1->node + uVar4 * 0x10 + 0x10);
    }
    else {
      lVar2 = *(long *)((long)&pEVar1[-1].node + lVar7);
      puVar3 = (ulong *)(lVar2 + uVar4 * 8);
      piVar5 = (interval<unsigned_long> *)(lVar2 + uVar4 * 0x10 + 0x40);
    }
    this_00 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
               *)(*puVar3 & 0xffffffffffffffc0);
    size = ((uint)*puVar3 & 0x3f) + 1;
    if (uVar6 == (int)(this->super_const_iterator).path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1) {
      iVar8 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
              ::getBounds((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_11U,_false>_>
                           *)this_00,size);
    }
    else {
      iVar8 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
              ::getBounds(this_00,size);
    }
    *piVar5 = iVar8;
    uVar6 = uVar6 - 1;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::recomputeBounds(uint32_t level) {
    using namespace IntervalMapDetails;

    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        interval<TKey>* key;
        NodeRef child;

        if (level == 0) {
            auto& branch = path.template node<RootBranch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }
        else {
            auto& branch = path.template node<Branch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }

        auto bounds = (level == path.height() - 1)
                          ? child.template get<Leaf>().getBounds(child.size())
                          : child.template get<Branch>().getBounds(child.size());
        *key = bounds;
    }
}